

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall
ON_MorphControl::AddConvexPolygonLocalizer
          (ON_MorphControl *this,ON_SimpleArray<ON_Plane> *planes,double support_distance,
          double falloff_distance)

{
  int iVar1;
  ON_Plane *pOVar2;
  ON_3dPoint P;
  ON_3dVector N;
  bool bVar3;
  ON_Localizer *this_00;
  long lVar4;
  long lVar5;
  
  bVar3 = false;
  if ((0.0 <= support_distance) && (bVar3 = false, 0.0 < falloff_distance)) {
    iVar1 = planes->m_count;
    ON_ClassArray<ON_Localizer>::Reserve
              (&this->m_localizers,(long)(this->m_localizers).m_count + (long)iVar1);
    bVar3 = true;
    lVar4 = 0;
    lVar5 = 0;
    while ((lVar5 < iVar1 && (bVar3 != false))) {
      pOVar2 = planes->m_a;
      this_00 = ON_ClassArray<ON_Localizer>::AppendNew(&this->m_localizers);
      P.z = *(double *)((long)&(pOVar2->origin).z + lVar4);
      P._0_16_ = *(undefined1 (*) [16])((long)&(pOVar2->origin).x + lVar4);
      N.z = *(double *)((long)&(pOVar2->zaxis).z + lVar4);
      N._0_16_ = *(undefined1 (*) [16])((long)&(pOVar2->zaxis).x + lVar4);
      bVar3 = ON_Localizer::CreatePlaneLocalizer
                        (this_00,P,N,falloff_distance + support_distance,support_distance);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x80;
    }
  }
  return bVar3;
}

Assistant:

bool ON_MorphControl::AddConvexPolygonLocalizer(
  const ON_SimpleArray<ON_Plane>& planes,
  double support_distance, 
  double falloff_distance
  )
{
  int i, count = planes.Count();
  bool rc = (support_distance >= 0.0 && falloff_distance > 0.0 );
  if (rc)
  {
    m_localizers.Reserve(m_localizers.Count() + count);
    for( i = 0; i < count && rc; i++)
    {
      const ON_Plane& plane = planes[i];
      ON_Localizer& localizer = m_localizers.AppendNew();
      rc = localizer.CreatePlaneLocalizer(
                    plane.origin,plane.zaxis,
                    support_distance+falloff_distance,
                    support_distance);
    }
  }
  return rc;
}